

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::scatterv<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *msgs,
                  vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,size_t recv_size,
                  int root,comm *comm)

{
  size_t sizes_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *msgs_00;
  int iVar1;
  size_type sVar2;
  reference out;
  allocator<int> local_3a;
  undefined1 local_39;
  comm *local_38;
  comm *comm_local;
  size_t sStack_28;
  int root_local;
  size_t recv_size_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes_local;
  int *msgs_local;
  vector<int,_std::allocator<int>_> *result;
  
  local_38 = comm;
  comm_local._4_4_ = root;
  sStack_28 = recv_size;
  recv_size_local = (size_t)sizes;
  sizes_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)msgs;
  msgs_local = (int *)__return_storage_ptr__;
  iVar1 = mxx::comm::rank(comm);
  if (root == iVar1) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)recv_size_local);
    iVar1 = mxx::comm::size(local_38);
    if (sVar2 != (long)iVar1) {
      assert_fail("root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                  ,0x170,"scatterv");
    }
  }
  sVar2 = sStack_28;
  local_39 = 0;
  std::allocator<int>::allocator(&local_3a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar2,&local_3a);
  std::allocator<int>::~allocator(&local_3a);
  msgs_00 = sizes_local;
  sizes_00 = recv_size_local;
  out = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
  scatterv<int>((int *)msgs_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)sizes_00,out
                ,sStack_28,comm_local._4_4_,local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatterv(const T* msgs, const std::vector<size_t>& sizes, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size()));
    std::vector<T> result(recv_size);
    scatterv(msgs, sizes, &result[0], recv_size, root, comm);
    return result;
}